

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Advect.cpp
# Opt level: O0

double __thiscall
Advect3D::interp(Advect3D *this,Field<double,_unsigned_short> *F,double x,double y,double z)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  unsigned_short *puVar8;
  int *piVar9;
  double *pdVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double u0;
  double u1;
  double t0;
  double t1;
  double s0;
  double s1;
  int local_58;
  unsigned_short local_54;
  ushort local_52;
  int local_50;
  uint16_t k1;
  uint16_t k0;
  int local_48;
  unsigned_short local_44;
  ushort local_42;
  int local_40;
  uint16_t j1;
  uint16_t j0;
  int local_38;
  unsigned_short local_34;
  ushort local_32;
  uint16_t i1;
  double dStack_30;
  uint16_t i0;
  double z_local;
  double y_local;
  double x_local;
  Field<double,_unsigned_short> *F_local;
  Advect3D *this_local;
  
  local_32 = (ushort)(int)x;
  local_38 = ((int)x & 0xffffU) + 1;
  _j1 = 1;
  dStack_30 = z;
  z_local = y;
  y_local = x;
  x_local = (double)F;
  F_local = (Field<double,_unsigned_short> *)this;
  puVar8 = Field<double,_unsigned_short>::x(F);
  local_40 = *puVar8 - 1;
  puVar8 = (unsigned_short *)std::clamp<int>(&local_38,(int *)&j1,&local_40);
  local_34 = *puVar8;
  local_42 = (ushort)(int)z_local;
  local_48 = ((int)z_local & 0xffffU) + 1;
  _k1 = 1;
  puVar8 = Field<double,_unsigned_short>::y((Field<double,_unsigned_short> *)x_local);
  local_50 = *puVar8 - 1;
  puVar8 = (unsigned_short *)std::clamp<int>(&local_48,(int *)&k1,&local_50);
  local_44 = *puVar8;
  local_52 = (ushort)(int)dStack_30;
  local_58 = ((int)dStack_30 & 0xffffU) + 1;
  s1._4_4_ = 1;
  puVar8 = Field<double,_unsigned_short>::z((Field<double,_unsigned_short> *)x_local);
  s1._0_4_ = *puVar8 - 1;
  piVar9 = std::clamp<int>(&local_58,(int *)((long)&s1 + 4),(int *)&s1);
  local_54 = (unsigned_short)*piVar9;
  dVar11 = y_local - (double)local_32;
  dVar12 = z_local - (double)local_42;
  dVar13 = dStack_30 - (double)local_52;
  dVar14 = 1.0 - dVar13;
  pdVar10 = Field<double,_unsigned_short>::operator()
                      ((Field<double,_unsigned_short> *)x_local,local_32,local_42,local_52);
  dVar1 = *pdVar10;
  pdVar10 = Field<double,_unsigned_short>::operator()
                      ((Field<double,_unsigned_short> *)x_local,local_32,local_42,local_54);
  dVar2 = *pdVar10;
  pdVar10 = Field<double,_unsigned_short>::operator()
                      ((Field<double,_unsigned_short> *)x_local,local_32,local_44,local_52);
  dVar3 = *pdVar10;
  pdVar10 = Field<double,_unsigned_short>::operator()
                      ((Field<double,_unsigned_short> *)x_local,local_32,local_44,local_54);
  dVar4 = *pdVar10;
  pdVar10 = Field<double,_unsigned_short>::operator()
                      ((Field<double,_unsigned_short> *)x_local,local_34,local_42,local_52);
  dVar5 = *pdVar10;
  pdVar10 = Field<double,_unsigned_short>::operator()
                      ((Field<double,_unsigned_short> *)x_local,local_34,local_42,local_54);
  dVar6 = *pdVar10;
  pdVar10 = Field<double,_unsigned_short>::operator()
                      ((Field<double,_unsigned_short> *)x_local,local_34,local_44,local_52);
  dVar7 = *pdVar10;
  pdVar10 = Field<double,_unsigned_short>::operator()
                      ((Field<double,_unsigned_short> *)x_local,local_34,local_44,local_54);
  return (1.0 - dVar11) *
         ((1.0 - dVar12) * (dVar14 * dVar1 + dVar13 * dVar2) +
         dVar12 * (dVar14 * dVar3 + dVar13 * dVar4)) +
         dVar11 * ((1.0 - dVar12) * (dVar14 * dVar5 + dVar13 * dVar6) +
                  dVar12 * (dVar14 * dVar7 + dVar13 * *pdVar10));
}

Assistant:

inline double Advect3D::interp(
        const Field<double, std::uint16_t>& F,
        const double x,
        const double y,
        const double z
    ) const
{
    const std::uint16_t i0 = static_cast<std::uint16_t>(x);
    const std::uint16_t i1 = std::clamp(i0 + 1, 1, static_cast<int>(F.x()-1));
    const std::uint16_t j0 = static_cast<std::uint16_t>(y);
    const std::uint16_t j1 = std::clamp(j0 + 1, 1, static_cast<int>(F.y()-1));
    const std::uint16_t k0 = static_cast<std::uint16_t>(z);
    const std::uint16_t k1 = std::clamp(k0 + 1, 1, static_cast<int>(F.z()-1));

    const double s1 = x - i0;
    const double s0 = 1.0 - s1;
    const double t1 = y - j0;
    const double t0 = 1.0 - t1;
    const double u1 = z - k0;
    const double u0 = 1.0 - u1;

    return s0 * (     t0 * ( u0 * F(i0, j0, k0) + u1 * F(i0, j0, k1) )
                    + t1 * ( u0 * F(i0, j1, k0) + u1 * F(i0, j1, k1) )
                )
         + s1 * (     t0 * ( u0 * F(i1, j0, k0) + u1 * F(i1, j0, k1) )
                    + t1 * ( u0 * F(i1, j1, k0) + u1 * F(i1, j1, k1) )
                );
}